

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall
QMainWindowLayout::setTabPosition
          (QMainWindowLayout *this,DockWidgetAreas areas,TabPosition tabPosition)

{
  int i;
  long lVar1;
  long in_FS_OFFSET;
  uint local_28 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28[4] = 4;
  local_28[5] = 1;
  local_28[6] = 8;
  local_28[7] = 2;
  local_28[0] = 2;
  local_28[1] = 0;
  local_28[2] = 3;
  local_28[3] = 1;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    if ((local_28[lVar1 + 4] &
        (uint)areas.super_QFlagsStorageHelper<Qt::DockWidgetArea,_4>.
              super_QFlagsStorage<Qt::DockWidgetArea>.i) != 0) {
      *(TabPosition *)(this + (ulong)local_28[lVar1] * 4 + 0x764) = tabPosition;
    }
  }
  updateTabBarShapes(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayout::setTabPosition(Qt::DockWidgetAreas areas, QTabWidget::TabPosition tabPosition)
{
    const Qt::DockWidgetArea dockWidgetAreas[] = {
        Qt::TopDockWidgetArea,
        Qt::LeftDockWidgetArea,
        Qt::BottomDockWidgetArea,
        Qt::RightDockWidgetArea
    };
    const QInternal::DockPosition dockPositions[] = {
        QInternal::TopDock,
        QInternal::LeftDock,
        QInternal::BottomDock,
        QInternal::RightDock
    };

    for (int i = 0; i < QInternal::DockCount; ++i)
        if (areas & dockWidgetAreas[i])
            tabPositions[dockPositions[i]] = tabPosition;

    updateTabBarShapes();
}